

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Spooky.cpp
# Opt level: O2

void SpookyHash::Hash128(void *message,size_t length,uint64 *hash1,uint64 *hash2)

{
  size_t sVar1;
  uint64 *__src;
  uint64 h9;
  uint64 h7;
  uint64 h6;
  uint64 h3;
  uint64 h11;
  uint64 h10;
  uint64 h8;
  uint64 h5;
  uint64 h4;
  uint64 h2;
  size_t local_c0;
  uint64 *local_b8;
  uint64 *local_b0;
  uint64 h1;
  uint64 h0;
  uint64 buf [12];
  
  if (length < 0xc0) {
    Short(message,length,hash1,hash2);
    return;
  }
  h9 = *hash1;
  h7 = *hash2;
  h11 = 0xdeadbeefdeadbeef;
  h8 = 0xdeadbeefdeadbeef;
  h2 = 0xdeadbeefdeadbeef;
  h5 = 0xdeadbeefdeadbeef;
  local_c0 = length % 0x60;
  __src = (uint64 *)((length - local_c0) + (long)message);
  h6 = h9;
  h3 = h9;
  h10 = h7;
  h4 = h7;
  local_b8 = hash1;
  local_b0 = hash2;
  h1 = h7;
  h0 = h9;
  for (; sVar1 = local_c0, message < __src; message = (void *)((long)message + 0x60)) {
    Mix((uint64 *)message,&h0,&h1,&h2,&h3,&h4,&h5,&h6,&h7,&h8,&h9,&h10,&h11);
  }
  memcpy(buf,__src,local_c0);
  memset((void *)((long)buf + sVar1),0,0x60 - sVar1);
  buf[0xb]._7_1_ = (undefined1)sVar1;
  Mix(buf,&h0,&h1,&h2,&h3,&h4,&h5,&h6,&h7,&h8,&h9,&h10,&h11);
  End(&h0,&h1,&h2,&h3,&h4,&h5,&h6,&h7,&h8,&h9,&h10,&h11);
  *local_b8 = h0;
  *local_b0 = h1;
  return;
}

Assistant:

void SpookyHash::Hash128(
    const void *message, 
    size_t length, 
    uint64 *hash1, 
    uint64 *hash2)
{
    if (length < sc_bufSize)
    {
        Short(message, length, hash1, hash2);
        return;
    }

    uint64 h0,h1,h2,h3,h4,h5,h6,h7,h8,h9,h10,h11;
    uint64 buf[sc_numVars];
    uint64 *end;
    union 
    { 
        const uint8 *p8; 
        uint64 *p64; 
        size_t i; 
    } u;
    size_t remainder;
    
    h0=h3=h6=h9  = *hash1;
    h1=h4=h7=h10 = *hash2;
    h2=h5=h8=h11 = sc_const;
    
    u.p8 = (const uint8 *)message;
    end = u.p64 + (length/sc_blockSize)*sc_numVars;

    // handle all whole sc_blockSize blocks of bytes
    if (ALLOW_UNALIGNED_READS || ((u.i & 0x7) == 0))
    {
        while (u.p64 < end)
        { 
            Mix(u.p64, h0,h1,h2,h3,h4,h5,h6,h7,h8,h9,h10,h11);
	    u.p64 += sc_numVars;
        }
    }
    else
    {
        while (u.p64 < end)
        {
            memcpy(buf, u.p64, sc_blockSize);
            Mix(buf, h0,h1,h2,h3,h4,h5,h6,h7,h8,h9,h10,h11);
	    u.p64 += sc_numVars;
        }
    }

    // handle the last partial block of sc_blockSize bytes
    remainder = (length - ((const uint8 *)end-(const uint8 *)message));
    memcpy(buf, end, remainder);
    memset(((uint8 *)buf)+remainder, 0, sc_blockSize-remainder);
    ((uint8 *)buf)[sc_blockSize-1] = remainder;
    Mix(buf, h0,h1,h2,h3,h4,h5,h6,h7,h8,h9,h10,h11);
    
    // do some final mixing 
    End(h0,h1,h2,h3,h4,h5,h6,h7,h8,h9,h10,h11);
    *hash1 = h0;
    *hash2 = h1;
}